

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

void __thiscall
slang::ast::SignalEventControl::serializeTo(SignalEventControl *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  sVar1 = ast::toString(this->edge);
  ASTSerializer::write(serializer,4,"edge",sVar1._M_len);
  if (this->iffCondition != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)this->iffCondition);
    return;
  }
  return;
}

Assistant:

void SignalEventControl::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    serializer.write("edge", toString(edge));

    if (iffCondition)
        serializer.write("iff", *iffCondition);
}